

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

void hd_context_free(nghttp2_hd_context *context)

{
  nghttp2_mem *mem;
  nghttp2_hd_entry *ent;
  ulong idx;
  
  mem = context->mem;
  for (idx = 0; idx < (context->hd_table).len; idx = idx + 1) {
    ent = hd_ringbuf_get(&context->hd_table,idx);
    nghttp2_hd_entry_free(ent);
    nghttp2_mem_free(mem,ent);
  }
  nghttp2_mem_free(mem,(context->hd_table).buffer);
  return;
}

Assistant:

static void hd_context_free(nghttp2_hd_context *context) {
  hd_ringbuf_free(&context->hd_table, context->mem);
}